

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O3

int LZ4_compress_forceExtDict(LZ4_stream_t *LZ4_dict,char *source,char *dest,int srcSize)

{
  ulong *puVar1;
  uint uVar2;
  uint uVar3;
  int *piVar4;
  long lVar5;
  char cVar6;
  long lVar7;
  ulong *puVar8;
  ulong uVar9;
  char *pcVar10;
  ulong *puVar11;
  int iVar12;
  uint uVar13;
  int *piVar14;
  int iVar15;
  ulong uVar16;
  ulong *puVar17;
  long lVar18;
  ulong *puVar19;
  char cVar20;
  ulong *puVar21;
  char *__s;
  BYTE *e_1;
  ulong uVar22;
  long lVar23;
  char *pcVar24;
  long lVar25;
  int *piVar26;
  uint uVar27;
  int iVar28;
  uint uVar29;
  int iVar30;
  ulong *puVar31;
  ulong *puVar32;
  ulong uVar33;
  BYTE *s;
  ulong *puVar34;
  ulong *puVar35;
  U32 *hashTable;
  char *local_c8;
  
  LZ4_renormDictT(&LZ4_dict->internal_donotuse,srcSize);
  uVar13 = (LZ4_dict->internal_donotuse).dictSize;
  uVar33 = (ulong)uVar13;
  uVar2 = (LZ4_dict->internal_donotuse).currentOffset;
  lVar25 = (long)source - (ulong)uVar2;
  lVar7 = -(ulong)uVar2;
  piVar4 = (int *)(LZ4_dict->internal_donotuse).dictionary;
  iVar30 = (int)lVar25;
  puVar34 = (ulong *)source;
  if (uVar13 < uVar2 && uVar13 < 0x10000) {
    if (0x7e000000 < (uint)srcSize) {
LAB_00117815:
      iVar30 = 0;
      goto LAB_00118000;
    }
    (LZ4_dict->internal_donotuse).dictSize = uVar13 + srcSize;
    (LZ4_dict->internal_donotuse).currentOffset = srcSize + uVar2;
    (LZ4_dict->internal_donotuse).tableType = 2;
    local_c8 = dest;
    if (0xc < (uint)srcSize) {
      puVar11 = (ulong *)(source + (long)srcSize + -0xb);
      puVar8 = (ulong *)(source + (long)srcSize + -5);
      lVar7 = (long)piVar4 + lVar7 + uVar33;
      *(uint *)((long)LZ4_dict + ((ulong)(*(long *)source * -0x30e4432345000000) >> 0x34) * 4) =
           uVar2;
      puVar35 = (ulong *)(source + 2);
      puVar21 = (ulong *)(source + 1);
      uVar27 = uVar2 + 1;
      puVar1 = (ulong *)(source + (long)srcSize + -0xc);
      local_c8 = dest;
LAB_0011719a:
      uVar9 = *(ulong *)((long)puVar34 + 1);
      uVar22 = 1;
      uVar29 = 0x41;
      do {
        uVar16 = uVar9 * -0x30e4432345000000 >> 0x34;
        uVar3 = *(uint *)((long)LZ4_dict + uVar16 * 4);
        uVar9 = *puVar35;
        *(uint *)((long)LZ4_dict + uVar16 * 4) = uVar27;
        if ((uVar2 - uVar13 <= uVar3) && (uVar27 <= uVar3 + 0xffff)) {
          lVar18 = lVar7;
          if (uVar2 <= uVar3) {
            lVar18 = lVar25;
          }
          if (*(int *)(lVar18 + (ulong)uVar3) == (int)*puVar21) goto LAB_00117225;
        }
        uVar27 = (int)puVar35 - iVar30;
        puVar17 = (ulong *)(uVar22 + (long)puVar35);
        uVar22 = (ulong)(uVar29 >> 6);
        puVar21 = puVar35;
        puVar35 = puVar17;
        uVar29 = uVar29 + 1;
        if (puVar11 < puVar17) break;
      } while( true );
    }
  }
  else {
    if (0x7e000000 < (uint)srcSize) goto LAB_00117815;
    (LZ4_dict->internal_donotuse).dictSize = uVar13 + srcSize;
    (LZ4_dict->internal_donotuse).currentOffset = srcSize + uVar2;
    (LZ4_dict->internal_donotuse).tableType = 2;
    local_c8 = dest;
    if (0xc < (uint)srcSize) {
      puVar11 = (ulong *)(source + (long)srcSize + -0xb);
      puVar8 = (ulong *)(source + (long)srcSize + -5);
      lVar7 = (long)piVar4 + lVar7 + uVar33;
      *(uint *)((long)LZ4_dict + ((ulong)(*(long *)source * -0x30e4432345000000) >> 0x34) * 4) =
           uVar2;
      puVar35 = (ulong *)(source + 2);
      puVar21 = (ulong *)(source + 1);
      uVar13 = uVar2 + 1;
      puVar1 = (ulong *)(source + (long)srcSize + -0xc);
      local_c8 = dest;
LAB_001178e9:
      uVar9 = *(ulong *)((long)puVar34 + 1);
      uVar22 = 1;
      uVar27 = 0x41;
      do {
        uVar16 = uVar9 * -0x30e4432345000000 >> 0x34;
        uVar29 = *(uint *)((long)LZ4_dict + uVar16 * 4);
        uVar9 = *puVar35;
        *(uint *)((long)LZ4_dict + uVar16 * 4) = uVar13;
        if (uVar13 <= uVar29 + 0xffff) {
          lVar18 = lVar7;
          if (uVar2 <= uVar29) {
            lVar18 = lVar25;
          }
          if (*(int *)(lVar18 + (ulong)uVar29) == (int)*puVar21) goto LAB_00117964;
        }
        uVar13 = (int)puVar35 - iVar30;
        puVar17 = (ulong *)(uVar22 + (long)puVar35);
        uVar22 = (ulong)(uVar27 >> 6);
        puVar21 = puVar35;
        puVar35 = puVar17;
        uVar27 = uVar27 + 1;
        if (puVar11 < puVar17) break;
      } while( true );
    }
  }
LAB_00117f51:
  pcVar24 = source + ((long)srcSize - (long)puVar34);
  if (pcVar24 < (char *)0xf) {
    *local_c8 = (char)pcVar24 << 4;
  }
  else {
    pcVar10 = pcVar24 + -0xf;
    *local_c8 = -0x10;
    __s = local_c8 + 1;
    if ((char *)0xfe < pcVar10) {
      uVar33 = (ulong)(pcVar24 + -0x10e) / 0xff;
      memset(__s,0xff,uVar33 + 1);
      __s = local_c8 + uVar33 + 2;
      pcVar10 = pcVar24 + uVar33 * -0xff + -0x10e;
    }
    *__s = (char)pcVar10;
    local_c8 = __s;
  }
  memcpy(local_c8 + 1,puVar34,(size_t)pcVar24);
  iVar30 = ((int)(local_c8 + 1) + (int)pcVar24) - (int)dest;
LAB_00118000:
  (LZ4_dict->internal_donotuse).dictionary = (uint8_t *)source;
  (LZ4_dict->internal_donotuse).dictSize = srcSize;
  return iVar30;
LAB_00117964:
  lVar18 = lVar18 + (ulong)uVar29;
  piVar14 = (int *)source;
  if (uVar29 < uVar2) {
    piVar14 = piVar4;
  }
  iVar12 = uVar13 - uVar29;
  iVar28 = (int)puVar21 - (int)puVar34;
  lVar5 = 0;
  uVar13 = iVar28 - 0xfU;
  cVar6 = (char)puVar21 * '\x10' + (char)puVar34 * -0x10;
  do {
    cVar20 = cVar6;
    uVar27 = uVar13;
    lVar23 = lVar5;
    piVar26 = (int *)(lVar18 + lVar23);
    puVar35 = (ulong *)((long)puVar21 + lVar23);
    if ((piVar26 <= piVar14) || (puVar35 <= puVar34)) break;
    lVar5 = lVar23 + -1;
    uVar13 = uVar27 - 1;
    cVar6 = cVar20 + -0x10;
  } while (*(char *)((long)puVar21 + lVar23 + -1) == *(char *)(lVar18 + -1 + lVar23));
  iVar15 = (int)lVar23;
  puVar21 = (ulong *)(local_c8 + 1);
  if ((uint)(iVar28 + iVar15) < 0xf) {
    *local_c8 = cVar20;
  }
  else {
    uVar9 = (ulong)(iVar28 - 0xfU) + lVar23;
    *local_c8 = -0x10;
    if (0xfe < (int)uVar9) {
      uVar13 = 0x1fd;
      if (uVar27 < 0x1fd) {
        uVar13 = uVar27;
      }
      if (0x1fc < (int)uVar27) {
        uVar27 = 0x1fd;
      }
      memset(puVar21,0xff,(ulong)((((iVar28 + 0xef) - uVar13) + iVar15) / 0xff + 1));
      uVar13 = ((iVar28 + 0xef) - uVar27) + iVar15;
      puVar21 = (ulong *)(local_c8 + (ulong)uVar13 / 0xff + 2);
      uVar9 = (ulong)(iVar28 + -0x10e + iVar15 + uVar13 / 0xff);
    }
    *(char *)puVar21 = (char)uVar9;
    puVar21 = (ulong *)((long)puVar21 + 1);
  }
  puVar17 = (ulong *)((ulong)(uint)((int)puVar35 - (int)puVar34) + (long)puVar21);
  do {
    *puVar21 = *puVar34;
    puVar21 = puVar21 + 1;
    puVar34 = puVar34 + 1;
  } while (puVar21 < puVar17);
  do {
    *(short *)puVar17 = (short)iVar12;
    if (piVar14 == piVar4) {
      puVar21 = (ulong *)((long)piVar4 + (uVar33 - (long)piVar26) + (long)puVar35);
      if (puVar8 < puVar21) {
        puVar21 = puVar8;
      }
      puVar34 = (ulong *)((long)puVar35 + 4);
      puVar19 = (ulong *)(piVar26 + 1);
      puVar31 = (ulong *)((long)puVar21 - 7);
      puVar32 = puVar34;
      if (puVar34 < puVar31) {
        if (*puVar19 == *puVar34) {
          puVar19 = (ulong *)(piVar26 + 3);
          puVar32 = (ulong *)((long)puVar35 + 0xc);
          goto LAB_00117bdf;
        }
        uVar9 = *puVar34 ^ *puVar19;
        lVar18 = 0;
        if (uVar9 != 0) {
          for (; (uVar9 >> lVar18 & 1) == 0; lVar18 = lVar18 + 1) {
          }
        }
        uVar13 = (uint)lVar18 >> 3;
      }
      else {
LAB_00117bdf:
        if (puVar32 < puVar31) {
          iVar12 = ((int)puVar32 - (int)puVar35) + -4;
LAB_00117bee:
          if (*puVar19 == *puVar32) break;
          uVar22 = *puVar32 ^ *puVar19;
          uVar9 = 0;
          if (uVar22 != 0) {
            for (; (uVar22 >> uVar9 & 1) == 0; uVar9 = uVar9 + 1) {
            }
          }
          uVar13 = ((uint)(uVar9 >> 3) & 0x1fffffff) + iVar12;
          goto LAB_00117c9c;
        }
LAB_00117c0e:
        if ((puVar32 < (ulong *)((long)puVar21 - 3U)) && ((int)*puVar19 == (int)*puVar32)) {
          puVar32 = (ulong *)((long)puVar32 + 4);
          puVar19 = (ulong *)((long)puVar19 + 4);
        }
        if ((puVar32 < (ulong *)((long)puVar21 - 1U)) && ((short)*puVar19 == (short)*puVar32)) {
          puVar32 = (ulong *)((long)puVar32 + 2);
          puVar19 = (ulong *)((long)puVar19 + 2);
        }
        if (puVar32 < puVar21) {
          puVar32 = (ulong *)((long)puVar32 + (ulong)((char)*puVar19 == (char)*puVar32));
        }
        uVar13 = (int)puVar32 - (int)puVar34;
      }
LAB_00117c9c:
      puVar34 = (ulong *)((long)puVar35 + (ulong)uVar13 + 4);
      if (puVar34 == puVar21) {
        puVar31 = puVar21;
        puVar19 = (ulong *)source;
        if (puVar21 < puVar1) {
          if (*(ulong *)source == *puVar21) {
            puVar31 = puVar21 + 1;
            puVar19 = (ulong *)(source + 8);
            goto LAB_00117cd7;
          }
          uVar9 = *puVar21 ^ *(ulong *)source;
          lVar18 = 0;
          if (uVar9 != 0) {
            for (; (uVar9 >> lVar18 & 1) == 0; lVar18 = lVar18 + 1) {
            }
          }
          uVar27 = (uint)lVar18 >> 3;
        }
        else {
LAB_00117cd7:
          if (puVar31 < puVar1) {
            puVar35 = (ulong *)((long)puVar35 + (long)piVar4 + (uVar33 - (long)piVar26));
            if (puVar8 <= puVar35) {
              puVar35 = puVar8;
            }
            iVar12 = (int)puVar31 - (int)puVar35;
LAB_00117d00:
            if (*puVar19 == *puVar31) goto code_r0x00117d0b;
            uVar22 = *puVar31 ^ *puVar19;
            uVar9 = 0;
            if (uVar22 != 0) {
              for (; (uVar22 >> uVar9 & 1) == 0; uVar9 = uVar9 + 1) {
              }
            }
            uVar27 = ((uint)(uVar9 >> 3) & 0x1fffffff) + iVar12;
            goto LAB_00117d95;
          }
LAB_00117d1c:
          if ((puVar31 < source + (long)srcSize + -8) && ((int)*puVar19 == (int)*puVar31)) {
            puVar31 = (ulong *)((long)puVar31 + 4);
            puVar19 = (ulong *)((long)puVar19 + 4);
          }
          if ((puVar31 < source + (long)srcSize + -6) && ((short)*puVar19 == (short)*puVar31)) {
            puVar31 = (ulong *)((long)puVar31 + 2);
            puVar19 = (ulong *)((long)puVar19 + 2);
          }
          if (puVar31 < puVar8) {
            puVar31 = (ulong *)((long)puVar31 + (ulong)((char)*puVar19 == (char)*puVar31));
          }
          uVar27 = (int)puVar31 - (int)puVar21;
        }
LAB_00117d95:
        uVar13 = uVar13 + uVar27;
        puVar34 = (ulong *)((long)puVar34 + (ulong)uVar27);
      }
    }
    else {
      puVar34 = (ulong *)((long)puVar35 + 4);
      puVar21 = (ulong *)(piVar26 + 1);
      puVar31 = puVar34;
      if (puVar34 < puVar1) {
        if (*puVar21 == *puVar34) {
          puVar21 = (ulong *)(piVar26 + 3);
          puVar31 = (ulong *)((long)puVar35 + 0xc);
          goto LAB_00117b17;
        }
        uVar9 = *puVar34 ^ *puVar21;
        lVar18 = 0;
        if (uVar9 != 0) {
          for (; (uVar9 >> lVar18 & 1) == 0; lVar18 = lVar18 + 1) {
          }
        }
        uVar13 = (uint)lVar18 >> 3;
      }
      else {
LAB_00117b17:
        if (puVar31 < puVar1) {
          iVar12 = ((int)puVar31 - (int)puVar35) + -4;
LAB_00117b29:
          if (*puVar21 == *puVar31) goto code_r0x00117b38;
          uVar22 = *puVar31 ^ *puVar21;
          uVar9 = 0;
          if (uVar22 != 0) {
            for (; (uVar22 >> uVar9 & 1) == 0; uVar9 = uVar9 + 1) {
            }
          }
          uVar13 = ((uint)(uVar9 >> 3) & 0x1fffffff) + iVar12;
          goto LAB_00117c6c;
        }
LAB_00117b48:
        if ((puVar31 < source + (long)srcSize + -8) && ((int)*puVar21 == (int)*puVar31)) {
          puVar31 = (ulong *)((long)puVar31 + 4);
          puVar21 = (ulong *)((long)puVar21 + 4);
        }
        if ((puVar31 < source + (long)srcSize + -6) && ((short)*puVar21 == (short)*puVar31)) {
          puVar31 = (ulong *)((long)puVar31 + 2);
          puVar21 = (ulong *)((long)puVar21 + 2);
        }
        if (puVar31 < puVar8) {
          puVar31 = (ulong *)((long)puVar31 + (ulong)((char)*puVar21 == (char)*puVar31));
        }
        uVar13 = (int)puVar31 - (int)puVar34;
      }
LAB_00117c6c:
      puVar34 = (ulong *)((long)puVar35 + (ulong)uVar13 + 4);
    }
    pcVar24 = (char *)((long)puVar17 + 2);
    if (uVar13 < 0xf) {
      *local_c8 = *local_c8 + (char)uVar13;
      local_c8 = pcVar24;
    }
    else {
      *local_c8 = *local_c8 + '\x0f';
      uVar27 = uVar13 - 0xf;
      pcVar24[0] = -1;
      pcVar24[1] = -1;
      pcVar24[2] = -1;
      pcVar24[3] = -1;
      if (0x3fb < uVar27) {
        uVar9 = (ulong)(((uVar13 - 0x40b) / 0x3fc) * 4);
        memset((char *)((long)puVar17 + 6),0xff,uVar9 + 4);
        uVar27 = (uVar13 - 0x40b) % 0x3fc;
        pcVar24 = (char *)((long)puVar17 + uVar9 + 6);
      }
      uVar13 = (uVar27 & 0xffff) / 0xff;
      pcVar24[uVar13] = (char)uVar13 + (char)uVar27;
      local_c8 = pcVar24 + uVar13 + 1;
    }
    if (puVar11 <= puVar34) goto LAB_00117f51;
    *(int *)((long)LZ4_dict +
            ((ulong)(*(long *)((long)puVar34 + -2) * -0x30e4432345000000) >> 0x34) * 4) =
         ((int)puVar34 + -2) - iVar30;
    uVar9 = *puVar34 * -0x30e4432345000000 >> 0x34;
    uVar27 = (int)puVar34 - iVar30;
    uVar13 = *(uint *)((long)LZ4_dict + uVar9 * 4);
    piVar14 = (int *)source;
    lVar18 = lVar25;
    if (uVar13 < uVar2) {
      piVar14 = piVar4;
      lVar18 = lVar7;
    }
    *(uint *)((long)LZ4_dict + uVar9 * 4) = uVar27;
    if ((uVar13 + 0xffff < uVar27) ||
       (piVar26 = (int *)(lVar18 + (ulong)uVar13), *piVar26 != (int)*puVar34)) goto LAB_00117ef6;
    puVar17 = (ulong *)(local_c8 + 1);
    *local_c8 = '\0';
    iVar12 = uVar27 - uVar13;
    puVar35 = puVar34;
  } while( true );
  puVar32 = puVar32 + 1;
  puVar19 = puVar19 + 1;
  iVar12 = iVar12 + 8;
  if (puVar31 <= puVar32) goto LAB_00117c0e;
  goto LAB_00117bee;
code_r0x00117d0b:
  puVar31 = puVar31 + 1;
  puVar19 = puVar19 + 1;
  iVar12 = iVar12 + 8;
  if (puVar1 <= puVar31) goto LAB_00117d1c;
  goto LAB_00117d00;
code_r0x00117b38:
  puVar31 = puVar31 + 1;
  puVar21 = puVar21 + 1;
  iVar12 = iVar12 + 8;
  if (puVar1 <= puVar31) goto LAB_00117b48;
  goto LAB_00117b29;
LAB_00117ef6:
  puVar21 = (ulong *)((long)puVar34 + 1);
  uVar13 = (int)puVar21 - iVar30;
  puVar35 = (ulong *)((long)puVar34 + 2);
  if (puVar11 < puVar35) goto LAB_00117f51;
  goto LAB_001178e9;
LAB_00117225:
  lVar18 = lVar18 + (ulong)uVar3;
  piVar14 = (int *)source;
  if (uVar3 < uVar2) {
    piVar14 = piVar4;
  }
  iVar28 = uVar27 - uVar3;
  iVar12 = (int)puVar21 - (int)puVar34;
  lVar5 = 0;
  cVar6 = (char)puVar21 * '\x10' + (char)puVar34 * -0x10;
  uVar27 = iVar12 - 0xfU;
  do {
    uVar29 = uVar27;
    cVar20 = cVar6;
    lVar23 = lVar5;
    piVar26 = (int *)(lVar18 + lVar23);
    puVar35 = (ulong *)((long)puVar21 + lVar23);
    if ((piVar26 <= piVar14) || (puVar35 <= puVar34)) break;
    lVar5 = lVar23 + -1;
    cVar6 = cVar20 + -0x10;
    uVar27 = uVar29 - 1;
  } while (*(char *)((long)puVar21 + lVar23 + -1) == *(char *)(lVar18 + -1 + lVar23));
  iVar15 = (int)lVar23;
  puVar21 = (ulong *)(local_c8 + 1);
  if ((uint)(iVar12 + iVar15) < 0xf) {
    *local_c8 = cVar20;
  }
  else {
    uVar9 = (ulong)(iVar12 - 0xfU) + lVar23;
    *local_c8 = -0x10;
    if (0xfe < (int)uVar9) {
      uVar27 = 0x1fd;
      if (uVar29 < 0x1fd) {
        uVar27 = uVar29;
      }
      if (0x1fc < (int)uVar29) {
        uVar29 = 0x1fd;
      }
      memset(puVar21,0xff,(ulong)((((iVar12 + 0xef) - uVar27) + iVar15) / 0xff + 1));
      uVar27 = ((iVar12 + 0xef) - uVar29) + iVar15;
      puVar21 = (ulong *)(local_c8 + (ulong)uVar27 / 0xff + 2);
      uVar9 = (ulong)(iVar12 + -0x10e + iVar15 + uVar27 / 0xff);
    }
    *(char *)puVar21 = (char)uVar9;
    puVar21 = (ulong *)((long)puVar21 + 1);
  }
  puVar17 = (ulong *)((ulong)(uint)((int)puVar35 - (int)puVar34) + (long)puVar21);
  do {
    *puVar21 = *puVar34;
    puVar21 = puVar21 + 1;
    puVar34 = puVar34 + 1;
  } while (puVar21 < puVar17);
  do {
    *(short *)puVar17 = (short)iVar28;
    if (piVar14 == piVar4) {
      puVar21 = (ulong *)((long)piVar4 + (uVar33 - (long)piVar26) + (long)puVar35);
      if (puVar8 < puVar21) {
        puVar21 = puVar8;
      }
      puVar34 = (ulong *)((long)puVar35 + 4);
      puVar19 = (ulong *)(piVar26 + 1);
      puVar31 = (ulong *)((long)puVar21 - 7);
      puVar32 = puVar34;
      if (puVar34 < puVar31) {
        if (*puVar19 == *puVar34) {
          puVar19 = (ulong *)(piVar26 + 3);
          puVar32 = (ulong *)((long)puVar35 + 0xc);
          goto LAB_001174b5;
        }
        uVar9 = *puVar34 ^ *puVar19;
        lVar18 = 0;
        if (uVar9 != 0) {
          for (; (uVar9 >> lVar18 & 1) == 0; lVar18 = lVar18 + 1) {
          }
        }
        uVar27 = (uint)lVar18 >> 3;
      }
      else {
LAB_001174b5:
        if (puVar32 < puVar31) {
          iVar12 = ((int)puVar32 - (int)puVar35) + -4;
LAB_001174c4:
          if (*puVar19 == *puVar32) break;
          uVar22 = *puVar32 ^ *puVar19;
          uVar9 = 0;
          if (uVar22 != 0) {
            for (; (uVar22 >> uVar9 & 1) == 0; uVar9 = uVar9 + 1) {
            }
          }
          uVar27 = ((uint)(uVar9 >> 3) & 0x1fffffff) + iVar12;
          goto LAB_0011755e;
        }
LAB_001174e1:
        if ((puVar32 < (ulong *)((long)puVar21 - 3U)) && ((int)*puVar19 == (int)*puVar32)) {
          puVar32 = (ulong *)((long)puVar32 + 4);
          puVar19 = (ulong *)((long)puVar19 + 4);
        }
        if ((puVar32 < (ulong *)((long)puVar21 - 1U)) && ((short)*puVar19 == (short)*puVar32)) {
          puVar32 = (ulong *)((long)puVar32 + 2);
          puVar19 = (ulong *)((long)puVar19 + 2);
        }
        if (puVar32 < puVar21) {
          puVar32 = (ulong *)((long)puVar32 + (ulong)((char)*puVar19 == (char)*puVar32));
        }
        uVar27 = (int)puVar32 - (int)puVar34;
      }
LAB_0011755e:
      puVar34 = (ulong *)((long)puVar35 + (ulong)uVar27 + 4);
      if (puVar34 == puVar21) {
        puVar31 = puVar21;
        puVar19 = (ulong *)source;
        if (puVar21 < puVar1) {
          if (*(ulong *)source == *puVar21) {
            puVar31 = puVar21 + 1;
            puVar19 = (ulong *)(source + 8);
            goto LAB_00117598;
          }
          uVar9 = *puVar21 ^ *(ulong *)source;
          lVar18 = 0;
          if (uVar9 != 0) {
            for (; (uVar9 >> lVar18 & 1) == 0; lVar18 = lVar18 + 1) {
            }
          }
          uVar29 = (uint)lVar18 >> 3;
        }
        else {
LAB_00117598:
          if (puVar31 < puVar1) {
            puVar35 = (ulong *)((long)puVar35 + (long)piVar4 + (uVar33 - (long)piVar26));
            if (puVar8 <= puVar35) {
              puVar35 = puVar8;
            }
            iVar12 = (int)puVar31 - (int)puVar35;
LAB_001175ba:
            if (*puVar19 == *puVar31) goto code_r0x001175c5;
            uVar22 = *puVar31 ^ *puVar19;
            uVar9 = 0;
            if (uVar22 != 0) {
              for (; (uVar22 >> uVar9 & 1) == 0; uVar9 = uVar9 + 1) {
              }
            }
            uVar29 = ((uint)(uVar9 >> 3) & 0x1fffffff) + iVar12;
            goto LAB_00117655;
          }
LAB_001175d6:
          if ((puVar31 < source + (long)srcSize + -8) && ((int)*puVar19 == (int)*puVar31)) {
            puVar31 = (ulong *)((long)puVar31 + 4);
            puVar19 = (ulong *)((long)puVar19 + 4);
          }
          if ((puVar31 < source + (long)srcSize + -6) && ((short)*puVar19 == (short)*puVar31)) {
            puVar31 = (ulong *)((long)puVar31 + 2);
            puVar19 = (ulong *)((long)puVar19 + 2);
          }
          if (puVar31 < puVar8) {
            puVar31 = (ulong *)((long)puVar31 + (ulong)((char)*puVar19 == (char)*puVar31));
          }
          uVar29 = (int)puVar31 - (int)puVar21;
        }
LAB_00117655:
        uVar27 = uVar27 + uVar29;
        puVar34 = (ulong *)((long)puVar34 + (ulong)uVar29);
      }
    }
    else {
      puVar34 = (ulong *)((long)puVar35 + 4);
      puVar21 = (ulong *)(piVar26 + 1);
      puVar31 = puVar34;
      if (puVar34 < puVar1) {
        if (*puVar21 == *puVar34) {
          puVar21 = (ulong *)(piVar26 + 3);
          puVar31 = (ulong *)((long)puVar35 + 0xc);
          goto LAB_001173e0;
        }
        uVar9 = *puVar34 ^ *puVar21;
        lVar18 = 0;
        if (uVar9 != 0) {
          for (; (uVar9 >> lVar18 & 1) == 0; lVar18 = lVar18 + 1) {
          }
        }
        uVar27 = (uint)lVar18 >> 3;
      }
      else {
LAB_001173e0:
        if (puVar31 < puVar1) {
          iVar12 = ((int)puVar31 - (int)puVar35) + -4;
LAB_001173f1:
          if (*puVar21 == *puVar31) goto code_r0x00117401;
          uVar22 = *puVar31 ^ *puVar21;
          uVar9 = 0;
          if (uVar22 != 0) {
            for (; (uVar22 >> uVar9 & 1) == 0; uVar9 = uVar9 + 1) {
            }
          }
          uVar27 = ((uint)(uVar9 >> 3) & 0x1fffffff) + iVar12;
          goto LAB_00117528;
        }
LAB_00117411:
        if ((puVar31 < source + (long)srcSize + -8) && ((int)*puVar21 == (int)*puVar31)) {
          puVar31 = (ulong *)((long)puVar31 + 4);
          puVar21 = (ulong *)((long)puVar21 + 4);
        }
        if ((puVar31 < source + (long)srcSize + -6) && ((short)*puVar21 == (short)*puVar31)) {
          puVar31 = (ulong *)((long)puVar31 + 2);
          puVar21 = (ulong *)((long)puVar21 + 2);
        }
        if (puVar31 < puVar8) {
          puVar31 = (ulong *)((long)puVar31 + (ulong)((char)*puVar21 == (char)*puVar31));
        }
        uVar27 = (int)puVar31 - (int)puVar34;
      }
LAB_00117528:
      puVar34 = (ulong *)((long)puVar35 + (ulong)uVar27 + 4);
    }
    pcVar24 = (char *)((long)puVar17 + 2);
    if (uVar27 < 0xf) {
      *local_c8 = *local_c8 + (char)uVar27;
    }
    else {
      *local_c8 = *local_c8 + '\x0f';
      uVar29 = uVar27 - 0xf;
      pcVar24[0] = -1;
      pcVar24[1] = -1;
      pcVar24[2] = -1;
      pcVar24[3] = -1;
      if (0x3fb < uVar29) {
        uVar9 = (ulong)(((uVar27 - 0x40b) / 0x3fc) * 4);
        memset((char *)((long)puVar17 + 6),0xff,uVar9 + 4);
        uVar29 = (uVar27 - 0x40b) % 0x3fc;
        pcVar24 = (char *)((long)puVar17 + uVar9 + 6);
      }
      uVar27 = (uVar29 & 0xffff) / 0xff;
      pcVar10 = pcVar24 + uVar27;
      pcVar24 = pcVar10 + 1;
      *pcVar10 = (char)uVar27 + (char)uVar29;
    }
    local_c8 = pcVar24;
    if (puVar11 <= puVar34) goto LAB_00117f51;
    *(int *)((long)LZ4_dict +
            ((ulong)(*(long *)((long)puVar34 + -2) * -0x30e4432345000000) >> 0x34) * 4) =
         ((int)puVar34 + -2) - iVar30;
    uVar9 = *puVar34 * -0x30e4432345000000 >> 0x34;
    uVar29 = (int)puVar34 - iVar30;
    uVar27 = *(uint *)((long)LZ4_dict + uVar9 * 4);
    piVar14 = (int *)source;
    lVar18 = lVar25;
    if (uVar27 < uVar2) {
      piVar14 = piVar4;
      lVar18 = lVar7;
    }
    *(uint *)((long)LZ4_dict + uVar9 * 4) = uVar29;
    if (((uVar27 < uVar2 - uVar13) || (uVar27 + 0xffff < uVar29)) ||
       (piVar26 = (int *)(lVar18 + (ulong)uVar27), *piVar26 != (int)*puVar34)) goto LAB_001177e5;
    puVar17 = (ulong *)(pcVar24 + 1);
    *pcVar24 = '\0';
    iVar28 = uVar29 - uVar27;
    puVar35 = puVar34;
  } while( true );
  puVar32 = puVar32 + 1;
  puVar19 = puVar19 + 1;
  iVar12 = iVar12 + 8;
  if (puVar31 <= puVar32) goto LAB_001174e1;
  goto LAB_001174c4;
code_r0x001175c5:
  puVar31 = puVar31 + 1;
  puVar19 = puVar19 + 1;
  iVar12 = iVar12 + 8;
  if (puVar1 <= puVar31) goto LAB_001175d6;
  goto LAB_001175ba;
code_r0x00117401:
  puVar31 = puVar31 + 1;
  puVar21 = puVar21 + 1;
  iVar12 = iVar12 + 8;
  if (puVar1 <= puVar31) goto LAB_00117411;
  goto LAB_001173f1;
LAB_001177e5:
  puVar21 = (ulong *)((long)puVar34 + 1);
  uVar27 = (int)puVar21 - iVar30;
  puVar35 = (ulong *)((long)puVar34 + 2);
  if (puVar11 < puVar35) goto LAB_00117f51;
  goto LAB_0011719a;
}

Assistant:

int LZ4_compress_forceExtDict (LZ4_stream_t* LZ4_dict, const char* source, char* dest, int srcSize)
{
    LZ4_stream_t_internal* streamPtr = &LZ4_dict->internal_donotuse;
    int result;

    LZ4_renormDictT(streamPtr, srcSize);

    if ((streamPtr->dictSize < 64 KB) && (streamPtr->dictSize < streamPtr->currentOffset)) {
        result = LZ4_compress_generic(streamPtr, source, dest, srcSize, NULL, 0, notLimited, byU32, usingExtDict, dictSmall, 1);
    } else {
        result = LZ4_compress_generic(streamPtr, source, dest, srcSize, NULL, 0, notLimited, byU32, usingExtDict, noDictIssue, 1);
    }

    streamPtr->dictionary = (const BYTE*)source;
    streamPtr->dictSize = (U32)srcSize;

    return result;
}